

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressStream2_simpleArgs
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,size_t *dstPos,void *src,
                 size_t srcSize,size_t *srcPos,ZSTD_EndDirective endOp)

{
  size_t sVar1;
  size_t sVar2;
  size_t cErr;
  ZSTD_inBuffer input;
  ZSTD_outBuffer output;
  size_t srcSize_local;
  void *src_local;
  size_t *dstPos_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  sVar1 = *dstPos;
  input.size = *srcPos;
  cErr = (size_t)src;
  input.src = (void *)srcSize;
  input.pos = (size_t)dst;
  sVar2 = ZSTD_compressStream2(cctx,(ZSTD_outBuffer *)&input.pos,(ZSTD_inBuffer *)&cErr,endOp);
  *dstPos = sVar1;
  *srcPos = input.size;
  return sVar2;
}

Assistant:

size_t ZSTD_compressStream2_simpleArgs (
                            ZSTD_CCtx* cctx,
                            void* dst, size_t dstCapacity, size_t* dstPos,
                      const void* src, size_t srcSize, size_t* srcPos,
                            ZSTD_EndDirective endOp)
{
    ZSTD_outBuffer output;
    ZSTD_inBuffer  input;
    output.dst = dst;
    output.size = dstCapacity;
    output.pos = *dstPos;
    input.src = src;
    input.size = srcSize;
    input.pos = *srcPos;
    /* ZSTD_compressStream2() will check validity of dstPos and srcPos */
    {   size_t const cErr = ZSTD_compressStream2(cctx, &output, &input, endOp);
        *dstPos = output.pos;
        *srcPos = input.pos;
        return cErr;
    }
}